

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O0

uint32_t __thiscall
duckdb::SimpleReadTransport::read_virt(SimpleReadTransport *this,uint8_t *buf,uint32_t len)

{
  uint in_EDX;
  void *in_RSI;
  long in_RDI;
  uint32_t remaining;
  undefined4 local_4;
  
  local_4 = *(int *)(in_RDI + 0x10) - *(int *)(in_RDI + 0x14);
  if (in_EDX <= local_4) {
    memcpy(in_RSI,(void *)(*(long *)(in_RDI + 8) + (ulong)*(uint *)(in_RDI + 0x14)),(ulong)in_EDX);
    *(uint *)(in_RDI + 0x14) = in_EDX + *(int *)(in_RDI + 0x14);
    local_4 = in_EDX;
  }
  return local_4;
}

Assistant:

uint32_t read_virt(uint8_t *buf, uint32_t len) override {
		const auto remaining = read_buffer_size - read_buffer_offset;
		if (len > remaining) {
			return remaining;
		}
		memcpy(buf, read_buffer + read_buffer_offset, len);
		read_buffer_offset += len;
		return len;
	}